

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_Proto2Features_Test::TestBody
          (FeaturesTest_Proto2Features_Test *this)

{
  bool bVar1;
  Utf8CheckMode UVar2;
  CppStringType CVar3;
  Descriptor *pDVar4;
  FileDescriptor *this_00;
  FieldDescriptor *pFVar5;
  FieldDescriptor *pFVar6;
  ConstType pTVar7;
  ConstType pCVar8;
  EnumDescriptor *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *gmock_p0;
  EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *matcher;
  char *in_R9;
  char *pcVar9;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  AssertionResult gtest_ar_10;
  string file_textproto;
  AssertHelper local_260;
  FileDescriptorProto proto;
  string local_160 [32];
  EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  FileDescriptorProto file_proto;
  
  proto.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)0x46f;
  proto.super_Message.super_MessageLite._internal_metadata_.ptr_ = (intptr_t)anon_var_dwarf_265d4d;
  ParseTextOrDie::operator_cast_to_FileDescriptorProto(&file_proto,(ParseTextOrDie *)&proto);
  ValidationErrorTest::BuildDescriptorMessagesInTestPool((ValidationErrorTest *)this);
  pDVar4 = pb::CppFeatures::GetDescriptor();
  ValidationErrorTest::BuildFileInTestPool((ValidationErrorTest *)this,pDVar4->file_);
  proto.super_Message.super_MessageLite._vptr_MessageLite =
       (_func_int **)
       DescriptorPool::BuildFile
                 (&(this->super_FeaturesTest).super_FeaturesBaseTest.pool_,&file_proto);
  this_00 = absl::lts_20250127::log_internal::DieIfNull<google::protobuf::FileDescriptor_const*>
                      ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                       ,0x203c,"pool_.BuildFile(file_proto)",(FileDescriptor **)&proto);
  pDVar4 = FileDescriptor::message_type(this_00,0);
  pFVar5 = Descriptor::field(pDVar4,0);
  pFVar6 = Descriptor::field(pDVar4,1);
  pcVar9 = anon_var_dwarf_651463 + 5;
  file_textproto._M_dataplus._M_p = anon_var_dwarf_651463 + 5;
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
            (&proto,(char *)&file_textproto,(FileOptions *)0xd7fba1);
  if ((char)proto.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
    testing::Message::Message((Message *)&file_textproto);
    if (proto.super_Message.super_MessageLite._internal_metadata_.ptr_ != 0) {
      pcVar9 = *(char **)proto.super_Message.super_MessageLite._internal_metadata_.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2040,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_2b0,(Message *)&file_textproto);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if (file_textproto._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)file_textproto._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&proto.super_Message.super_MessageLite._internal_metadata_);
  pTVar7 = FeatureSet::
           GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                     (this_00->merged_features_,
                      (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                       *)&pb::test);
  file_textproto._M_dataplus._M_p._0_4_ = (pTVar7->field_0)._impl_.file_feature_;
  local_2b0.matcher_.
  super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .params_.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p._0_4_ = 1;
  testing::internal::CmpHelperEQ<pb::EnumFeature,pb::EnumFeature>
            ((internal *)&proto,"GetFeatures(file).GetExtension(pb::test).file_feature()",
             "pb::VALUE1",(EnumFeature *)&file_textproto,(EnumFeature *)&local_2b0);
  if ((char)proto.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
    testing::Message::Message((Message *)&file_textproto);
    if (proto.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
      pcVar9 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar9 = *(char **)proto.super_Message.super_MessageLite._internal_metadata_.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2042,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_2b0,(Message *)&file_textproto);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if (file_textproto._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)file_textproto._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&proto.super_Message.super_MessageLite._internal_metadata_);
  local_2b0.matcher_.
  super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .params_.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p =
       "\n                field_presence: EXPLICIT\n                enum_type: CLOSED\n                repeated_field_encoding: EXPANDED\n                utf8_validation: NONE\n                message_encoding: LENGTH_PREFIXED\n                json_format: LEGACY_BEST_EFFORT\n                enforce_naming_style: STYLE_LEGACY\n                default_symbol_visibility: EXPORT_ALL\n                [pb.cpp] {\n                  legacy_closed_enum: true\n                  string_type: STRING\n                  enum_name_uses_string_view: false\n                }"
  ;
  GetCoreFeatures<google::protobuf::FileDescriptor>((FeatureSet *)&proto,this_00);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
            (&file_textproto,(char *)&local_2b0,(FeatureSet *)"GetCoreFeatures(file)");
  FeatureSet::~FeatureSet((FeatureSet *)&proto);
  if ((Utf8CheckMode)file_textproto._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&proto);
    if (file_textproto._M_string_length == 0) {
      pcVar9 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar9 = *(char **)file_textproto._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2050,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)&proto);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if (proto.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*proto.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&file_textproto._M_string_length);
  local_2b0.matcher_.
  super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .params_.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p =
       "\n                field_presence: EXPLICIT\n                enum_type: CLOSED\n                repeated_field_encoding: EXPANDED\n                utf8_validation: NONE\n                message_encoding: LENGTH_PREFIXED\n                json_format: LEGACY_BEST_EFFORT\n                enforce_naming_style: STYLE_LEGACY\n                default_symbol_visibility: EXPORT_ALL\n                [pb.cpp] {\n                  legacy_closed_enum: true\n                  string_type: STRING\n                  enum_name_uses_string_view: false\n                }"
  ;
  GetCoreFeatures<google::protobuf::FieldDescriptor>((FeatureSet *)&proto,pFVar5);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
            (&file_textproto,(char *)&local_2b0,(FeatureSet *)"GetCoreFeatures(field)");
  FeatureSet::~FeatureSet((FeatureSet *)&proto);
  if ((Utf8CheckMode)file_textproto._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&proto);
    if (file_textproto._M_string_length == 0) {
      pcVar9 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar9 = *(char **)file_textproto._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x205e,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)&proto);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if (proto.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*proto.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&file_textproto._M_string_length);
  local_2b0.matcher_.
  super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .params_.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p =
       "\n                field_presence: EXPLICIT\n                enum_type: CLOSED\n                repeated_field_encoding: EXPANDED\n                utf8_validation: NONE\n                message_encoding: DELIMITED\n                json_format: LEGACY_BEST_EFFORT\n                enforce_naming_style: STYLE_LEGACY\n                default_symbol_visibility: EXPORT_ALL\n                [pb.cpp] {\n                  legacy_closed_enum: true\n                  string_type: STRING\n                  enum_name_uses_string_view: false\n                }"
  ;
  GetCoreFeatures<google::protobuf::FieldDescriptor>((FeatureSet *)&proto,pFVar6);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
            (&file_textproto,(char *)&local_2b0,(FeatureSet *)"GetCoreFeatures(group)");
  FeatureSet::~FeatureSet((FeatureSet *)&proto);
  if ((Utf8CheckMode)file_textproto._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&proto);
    if (file_textproto._M_string_length == 0) {
      pcVar9 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar9 = *(char **)file_textproto._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x206c,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)&proto);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if (proto.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*proto.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&file_textproto._M_string_length);
  bVar1 = FieldDescriptor::has_presence(pFVar5);
  file_textproto._M_dataplus._M_p._0_1_ = bVar1;
  file_textproto._M_string_length = 0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&proto,(internal *)&file_textproto,(AssertionResult *)0x10f18af,"false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x206d,(char *)proto.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
    std::__cxx11::string::~string((string *)&proto);
    if ((long *)local_2b0.matcher_.
                super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .params_.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                ._M_head_impl._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2b0.matcher_.
                            super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .params_.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&file_textproto._M_string_length);
  bVar1 = FieldDescriptor::requires_utf8_validation(pFVar5);
  file_textproto._M_dataplus._M_p._0_1_ = !bVar1;
  file_textproto._M_string_length = 0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&proto,(internal *)&file_textproto,(AssertionResult *)0xd85e4d,"true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x206e,(char *)proto.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
    std::__cxx11::string::~string((string *)&proto);
    if ((long *)local_2b0.matcher_.
                super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .params_.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                ._M_head_impl._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2b0.matcher_.
                            super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .params_.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&file_textproto._M_string_length);
  name._M_str = "str";
  name._M_len = 3;
  pFVar6 = Descriptor::FindFieldByName(pDVar4,name);
  UVar2 = internal::cpp::GetUtf8CheckMode(pFVar6,false);
  file_textproto._M_dataplus._M_p._0_1_ = UVar2;
  local_2b0.matcher_.
  super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .params_.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p._0_1_ = 1;
  testing::internal::
  CmpHelperEQ<google::protobuf::internal::cpp::Utf8CheckMode,google::protobuf::internal::cpp::Utf8CheckMode>
            ((internal *)&proto,"GetUtf8CheckMode(message->FindFieldByName(\"str\"), false)",
             "Utf8CheckMode::kVerify",(Utf8CheckMode *)&file_textproto,(Utf8CheckMode *)&local_2b0);
  if ((char)proto.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
    testing::Message::Message((Message *)&file_textproto);
    if (proto.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
      pcVar9 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar9 = *(char **)proto.super_Message.super_MessageLite._internal_metadata_.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2071,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_2b0,(Message *)&file_textproto);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if (file_textproto._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)file_textproto._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&proto.super_Message.super_MessageLite._internal_metadata_);
  name_00._M_str = "str";
  name_00._M_len = 3;
  pFVar6 = Descriptor::FindFieldByName(pDVar4,name_00);
  UVar2 = internal::cpp::GetUtf8CheckMode(pFVar6,true);
  file_textproto._M_dataplus._M_p._0_1_ = UVar2;
  local_2b0.matcher_.
  super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .params_.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p._0_1_ = 2;
  testing::internal::
  CmpHelperEQ<google::protobuf::internal::cpp::Utf8CheckMode,google::protobuf::internal::cpp::Utf8CheckMode>
            ((internal *)&proto,"GetUtf8CheckMode(message->FindFieldByName(\"str\"), true)",
             "Utf8CheckMode::kNone",(Utf8CheckMode *)&file_textproto,(Utf8CheckMode *)&local_2b0);
  if ((char)proto.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
    testing::Message::Message((Message *)&file_textproto);
    if (proto.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
      pcVar9 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar9 = *(char **)proto.super_Message.super_MessageLite._internal_metadata_.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2073,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_2b0,(Message *)&file_textproto);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if (file_textproto._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)file_textproto._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&proto.super_Message.super_MessageLite._internal_metadata_);
  name_01._M_str = "cord";
  name_01._M_len = 4;
  pFVar6 = Descriptor::FindFieldByName(pDVar4,name_01);
  GetCoreFeatures<google::protobuf::FieldDescriptor>((FeatureSet *)&proto,pFVar6);
  pCVar8 = FeatureSet::
           GetExtension<google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false,_0>
                     ((FeatureSet *)&proto,
                      (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false>
                       *)&pb::cpp);
  local_2b0.matcher_.
  super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .params_.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p._0_4_ = (pCVar8->field_0)._impl_.string_type_;
  testing::internal::CmpHelperEQ<pb::CppFeatures_StringType,pb::CppFeatures_StringType>
            ((internal *)&file_textproto,
             "GetCoreFeatures(message->FindFieldByName(\"cord\")) .GetExtension(pb::cpp) .string_type()"
             ,"pb::CppFeatures::CORD",(CppFeatures_StringType *)&local_2b0,&pb::CppFeatures::CORD);
  FeatureSet::~FeatureSet((FeatureSet *)&proto);
  if ((Utf8CheckMode)file_textproto._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&proto);
    if (file_textproto._M_string_length == 0) {
      pcVar9 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar9 = *(char **)file_textproto._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2077,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b0,(Message *)&proto);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if (proto.super_Message.super_MessageLite._vptr_MessageLite != (_func_int **)0x0) {
      (**(code **)(*proto.super_Message.super_MessageLite._vptr_MessageLite + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&file_textproto._M_string_length);
  bVar1 = FieldDescriptor::is_packed(pFVar5);
  file_textproto._M_dataplus._M_p._0_1_ = !bVar1;
  file_textproto._M_string_length = 0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&proto,(internal *)&file_textproto,(AssertionResult *)0xd85f80,"true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2078,(char *)proto.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
    std::__cxx11::string::~string((string *)&proto);
    if ((long *)local_2b0.matcher_.
                super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .params_.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                ._M_head_impl._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2b0.matcher_.
                            super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .params_.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&file_textproto._M_string_length);
  bVar1 = FieldDescriptor::legacy_enum_field_treated_as_closed(pFVar5);
  file_textproto._M_dataplus._M_p._0_1_ = !bVar1;
  file_textproto._M_string_length = 0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&proto,(internal *)&file_textproto,
               (AssertionResult *)"field->legacy_enum_field_treated_as_closed()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2079,(char *)proto.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
    std::__cxx11::string::~string((string *)&proto);
    if ((long *)local_2b0.matcher_.
                super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .params_.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                ._M_head_impl._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2b0.matcher_.
                            super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .params_.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&file_textproto._M_string_length);
  bVar1 = internal::cpp::HasPreservingUnknownEnumSemantics(pFVar5);
  file_textproto._M_dataplus._M_p._0_1_ = !bVar1;
  file_textproto._M_string_length = 0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&proto,(internal *)&file_textproto,
               (AssertionResult *)"HasPreservingUnknownEnumSemantics(field)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x207a,(char *)proto.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
    std::__cxx11::string::~string((string *)&proto);
    if ((long *)local_2b0.matcher_.
                super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .params_.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                ._M_head_impl._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2b0.matcher_.
                            super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .params_.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&file_textproto._M_string_length);
  name_02._M_str = "str";
  name_02._M_len = 3;
  pFVar5 = Descriptor::FindFieldByName(pDVar4,name_02);
  bVar1 = FieldDescriptor::requires_utf8_validation(pFVar5);
  file_textproto._M_dataplus._M_p._0_1_ = !bVar1;
  file_textproto._M_string_length = 0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&proto,(internal *)&file_textproto,
               (AssertionResult *)"message->FindFieldByName(\"str\")->requires_utf8_validation()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x207b,(char *)proto.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
    std::__cxx11::string::~string((string *)&proto);
    if ((long *)local_2b0.matcher_.
                super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .params_.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                ._M_head_impl._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2b0.matcher_.
                            super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .params_.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&file_textproto._M_string_length);
  name_03._M_str = "rep";
  name_03._M_len = 3;
  pFVar5 = Descriptor::FindFieldByName(pDVar4,name_03);
  bVar1 = FieldDescriptor::is_packed(pFVar5);
  file_textproto._M_dataplus._M_p._0_1_ = !bVar1;
  file_textproto._M_string_length = 0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&proto,(internal *)&file_textproto,
               (AssertionResult *)"message->FindFieldByName(\"rep\")->is_packed()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x207c,(char *)proto.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
    std::__cxx11::string::~string((string *)&proto);
    if ((long *)local_2b0.matcher_.
                super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .params_.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                ._M_head_impl._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2b0.matcher_.
                            super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .params_.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&file_textproto._M_string_length);
  name_04._M_str = "utf8";
  name_04._M_len = 4;
  pFVar5 = Descriptor::FindFieldByName(pDVar4,name_04);
  bVar1 = FieldDescriptor::requires_utf8_validation(pFVar5);
  file_textproto._M_dataplus._M_p._0_1_ = !bVar1;
  file_textproto._M_string_length = 0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&proto,(internal *)&file_textproto,
               (AssertionResult *)"message->FindFieldByName(\"utf8\")->requires_utf8_validation()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x207d,(char *)proto.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
    std::__cxx11::string::~string((string *)&proto);
    if ((long *)local_2b0.matcher_.
                super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .params_.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                ._M_head_impl._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2b0.matcher_.
                            super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .params_.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&file_textproto._M_string_length);
  name_05._M_str = "packed";
  name_05._M_len = 6;
  pFVar5 = Descriptor::FindFieldByName(pDVar4,name_05);
  bVar1 = FieldDescriptor::is_packed(pFVar5);
  file_textproto._M_dataplus._M_p._0_1_ = bVar1;
  file_textproto._M_string_length = 0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&proto,(internal *)&file_textproto,
               (AssertionResult *)"message->FindFieldByName(\"packed\")->is_packed()","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x207e,(char *)proto.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
    std::__cxx11::string::~string((string *)&proto);
    if ((long *)local_2b0.matcher_.
                super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .params_.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                ._M_head_impl._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2b0.matcher_.
                            super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .params_.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&file_textproto._M_string_length);
  name_06._M_str = "req";
  name_06._M_len = 3;
  pFVar5 = Descriptor::FindFieldByName(pDVar4,name_06);
  bVar1 = FieldDescriptor::is_required(pFVar5);
  file_textproto._M_dataplus._M_p._0_1_ = bVar1;
  file_textproto._M_string_length = 0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&proto,(internal *)&file_textproto,
               (AssertionResult *)"message->FindFieldByName(\"req\")->is_required()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x207f,(char *)proto.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
    std::__cxx11::string::~string((string *)&proto);
    if ((long *)local_2b0.matcher_.
                super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .params_.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                ._M_head_impl._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2b0.matcher_.
                            super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .params_.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&file_textproto._M_string_length);
  this_01 = FileDescriptor::enum_type(this_00,0);
  bVar1 = EnumDescriptor::is_closed(this_01);
  file_textproto._M_dataplus._M_p._0_1_ = bVar1;
  file_textproto._M_string_length = 0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&proto,(internal *)&file_textproto,
               (AssertionResult *)"file->enum_type(0)->is_closed()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2080,(char *)proto.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10);
    std::__cxx11::string::~string((string *)&proto);
    if ((long *)local_2b0.matcher_.
                super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .params_.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                ._M_head_impl._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2b0.matcher_.
                            super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .params_.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&file_textproto._M_string_length);
  name_07._M_str = "str";
  name_07._M_len = 3;
  pFVar5 = Descriptor::FindFieldByName(pDVar4,name_07);
  CVar3 = FieldDescriptor::cpp_string_type(pFVar5);
  file_textproto._M_dataplus._M_p._0_4_ = CVar3;
  local_2b0.matcher_.
  super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .params_.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p._0_4_ = 3;
  testing::internal::
  CmpHelperEQ<google::protobuf::internal::FieldDescriptorLite::CppStringType,google::protobuf::internal::FieldDescriptorLite::CppStringType>
            ((internal *)&proto,"message->FindFieldByName(\"str\")->cpp_string_type()",
             "FieldDescriptor::CppStringType::kString",(CppStringType *)&file_textproto,
             (CppStringType *)&local_2b0);
  if ((char)proto.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
    testing::Message::Message((Message *)&file_textproto);
    if (proto.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
      pcVar9 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar9 = *(char **)proto.super_Message.super_MessageLite._internal_metadata_.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2083,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_2b0,(Message *)&file_textproto);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if (file_textproto._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)file_textproto._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&proto.super_Message.super_MessageLite._internal_metadata_);
  name_08._M_str = "cord";
  name_08._M_len = 4;
  pFVar5 = Descriptor::FindFieldByName(pDVar4,name_08);
  CVar3 = FieldDescriptor::cpp_string_type(pFVar5);
  file_textproto._M_dataplus._M_p._0_4_ = CVar3;
  local_2b0.matcher_.
  super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .params_.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p._0_4_ = 2;
  testing::internal::
  CmpHelperEQ<google::protobuf::internal::FieldDescriptorLite::CppStringType,google::protobuf::internal::FieldDescriptorLite::CppStringType>
            ((internal *)&proto,"message->FindFieldByName(\"cord\")->cpp_string_type()",
             "FieldDescriptor::CppStringType::kCord",(CppStringType *)&file_textproto,
             (CppStringType *)&local_2b0);
  if ((char)proto.super_Message.super_MessageLite._vptr_MessageLite == '\0') {
    testing::Message::Message((Message *)&file_textproto);
    if (proto.super_Message.super_MessageLite._internal_metadata_.ptr_ == 0) {
      pcVar9 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar9 = *(char **)proto.super_Message.super_MessageLite._internal_metadata_.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x2085,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_2b0,(Message *)&file_textproto);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b0);
    if (file_textproto._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)file_textproto._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&proto.super_Message.super_MessageLite._internal_metadata_);
  FileDescriptorProto::FileDescriptorProto(&proto);
  FileDescriptor::CopyTo(this_00,&proto);
  file_textproto._M_dataplus._M_p = (pointer)&file_textproto.field_2;
  file_textproto._M_string_length = 0;
  file_textproto.field_2._M_local_buf[0] = '\0';
  TextFormat::PrintToString(&file_proto.super_Message,&file_textproto);
  std::__cxx11::string::string(local_160,(string *)&file_textproto);
  EqualsProto<std::__cxx11::string>(&local_140,(protobuf *)local_160,gmock_p0);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<std::__cxx11::string>>
            (&local_2b0,(internal *)&local_140,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<std::__cxx11::string>>::
  operator()(&gtest_ar_10,(char *)&local_2b0,(FileDescriptorProto *)0x10a4bd8);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string(local_160);
  if (gtest_ar_10.success_ == false) {
    testing::Message::Message((Message *)&local_2b0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_10.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar9 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar9 = *(char **)gtest_ar_10.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x208c,pcVar9);
    testing::internal::AssertHelper::operator=(&local_260,(Message *)&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    if ((long *)local_2b0.matcher_.
                super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .params_.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                ._M_head_impl._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2b0.matcher_.
                            super_MatcherBaseImpl<google::protobuf::EqualsProtoMatcherP<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .params_.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_10.message_);
  std::__cxx11::string::~string((string *)&file_textproto);
  FileDescriptorProto::~FileDescriptorProto(&proto);
  FileDescriptorProto::~FileDescriptorProto(&file_proto);
  return;
}

Assistant:

TEST_F(FeaturesTest, Proto2Features) {
  FileDescriptorProto file_proto = ParseTextOrDie(R"pb(
    name: "foo.proto"
    message_type {
      name: "Foo"
      field { name: "bar" number: 1 label: LABEL_OPTIONAL type: TYPE_INT64 }
      field {
        name: "group"
        number: 2
        label: LABEL_OPTIONAL
        type: TYPE_GROUP
        type_name: ".Foo"
      }
      field { name: "str" number: 3 label: LABEL_OPTIONAL type: TYPE_STRING }
      field { name: "rep" number: 4 label: LABEL_REPEATED type: TYPE_INT32 }
      field {
        name: "packed"
        number: 5
        label: LABEL_REPEATED
        type: TYPE_INT64
        options { packed: true }
      }
      field { name: "utf8" number: 6 label: LABEL_REPEATED type: TYPE_STRING }
      field { name: "req" number: 7 label: LABEL_REQUIRED type: TYPE_INT32 }
      field {
        name: "cord"
        number: 8
        label: LABEL_OPTIONAL
        type: TYPE_BYTES
        options { ctype: CORD }
      }
      field {
        name: "piece"
        number: 9
        label: LABEL_OPTIONAL
        type: TYPE_STRING
        options { ctype: STRING_PIECE }
      }
    }
    enum_type {
      name: "Foo2"
      value { name: "BAR" number: 1 }
    }
  )pb");

  BuildDescriptorMessagesInTestPool();
  BuildFileInTestPool(pb::CppFeatures::GetDescriptor()->file());
  const FileDescriptor* file = ABSL_DIE_IF_NULL(pool_.BuildFile(file_proto));
  const Descriptor* message = file->message_type(0);
  const FieldDescriptor* field = message->field(0);
  const FieldDescriptor* group = message->field(1);
  EXPECT_THAT(file->options(), EqualsProto(""));
  EXPECT_EQ(GetFeatures(file).GetExtension(pb::test).file_feature(),
            pb::VALUE1);
  EXPECT_THAT(GetCoreFeatures(file), EqualsProto(R"pb(
                field_presence: EXPLICIT
                enum_type: CLOSED
                repeated_field_encoding: EXPANDED
                utf8_validation: NONE
                message_encoding: LENGTH_PREFIXED
                json_format: LEGACY_BEST_EFFORT
                enforce_naming_style: STYLE_LEGACY
                default_symbol_visibility: EXPORT_ALL
                [pb.cpp] {
                  legacy_closed_enum: true
                  string_type: STRING
                  enum_name_uses_string_view: false
                })pb"));
  EXPECT_THAT(GetCoreFeatures(field), EqualsProto(R"pb(
                field_presence: EXPLICIT
                enum_type: CLOSED
                repeated_field_encoding: EXPANDED
                utf8_validation: NONE
                message_encoding: LENGTH_PREFIXED
                json_format: LEGACY_BEST_EFFORT
                enforce_naming_style: STYLE_LEGACY
                default_symbol_visibility: EXPORT_ALL
                [pb.cpp] {
                  legacy_closed_enum: true
                  string_type: STRING
                  enum_name_uses_string_view: false
                })pb"));
  EXPECT_THAT(GetCoreFeatures(group), EqualsProto(R"pb(
                field_presence: EXPLICIT
                enum_type: CLOSED
                repeated_field_encoding: EXPANDED
                utf8_validation: NONE
                message_encoding: DELIMITED
                json_format: LEGACY_BEST_EFFORT
                enforce_naming_style: STYLE_LEGACY
                default_symbol_visibility: EXPORT_ALL
                [pb.cpp] {
                  legacy_closed_enum: true
                  string_type: STRING
                  enum_name_uses_string_view: false
                })pb"));
  EXPECT_TRUE(field->has_presence());
  EXPECT_FALSE(field->requires_utf8_validation());
  EXPECT_EQ(
      GetUtf8CheckMode(message->FindFieldByName("str"), /*is_lite=*/false),
      Utf8CheckMode::kVerify);
  EXPECT_EQ(GetUtf8CheckMode(message->FindFieldByName("str"), /*is_lite=*/true),
            Utf8CheckMode::kNone);
  EXPECT_EQ(GetCoreFeatures(message->FindFieldByName("cord"))
                .GetExtension(pb::cpp)
                .string_type(),
            pb::CppFeatures::CORD);
  EXPECT_FALSE(field->is_packed());
  EXPECT_FALSE(field->legacy_enum_field_treated_as_closed());
  EXPECT_FALSE(HasPreservingUnknownEnumSemantics(field));
  EXPECT_FALSE(message->FindFieldByName("str")->requires_utf8_validation());
  EXPECT_FALSE(message->FindFieldByName("rep")->is_packed());
  EXPECT_FALSE(message->FindFieldByName("utf8")->requires_utf8_validation());
  EXPECT_TRUE(message->FindFieldByName("packed")->is_packed());
  EXPECT_TRUE(message->FindFieldByName("req")->is_required());
  EXPECT_TRUE(file->enum_type(0)->is_closed());

  EXPECT_EQ(message->FindFieldByName("str")->cpp_string_type(),
            FieldDescriptor::CppStringType::kString);
  EXPECT_EQ(message->FindFieldByName("cord")->cpp_string_type(),
            FieldDescriptor::CppStringType::kCord);

  // Check round-trip consistency.
  FileDescriptorProto proto;
  file->CopyTo(&proto);
  std::string file_textproto;
  google::protobuf::TextFormat::PrintToString(file_proto, &file_textproto);
  EXPECT_THAT(proto, EqualsProto(file_textproto));
}